

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O2

int isobusfs_cmn_configure_socket_filter(int sock,pgn_t pgn)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint __errnum;
  j1939_filter sock_filter [2];
  
  sock_filter[1].pgn = 0;
  sock_filter[1].pgn_mask = 0;
  sock_filter[1].addr = '\0';
  sock_filter[1].addr_mask = '\0';
  sock_filter[1]._26_6_ = 0;
  sock_filter[1].name = 0;
  sock_filter[1].name_mask = 0;
  sock_filter[0].pgn = 0;
  sock_filter[0].pgn_mask = 0;
  sock_filter[0].addr = '\0';
  sock_filter[0].addr_mask = '\0';
  sock_filter[0]._26_6_ = 0;
  sock_filter[0].name = 0;
  sock_filter[0].name_mask = 0;
  if ((pgn & 0xfffffeff) == 0xaa00) {
    sock_filter[0].pgn_mask = 0x3ff00;
    sock_filter[0].pgn = pgn;
    sock_filter[1].pgn = 0xe800;
    sock_filter[1].pgn_mask = 0x3ff00;
    iVar1 = setsockopt(sock,0x6b,1,sock_filter,0x40);
    __errnum = 0;
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      __errnum = -*piVar2;
      pcVar3 = strerror(__errnum);
      isobusfs_log(LOG_LEVEL_ERROR,"failed to set j1939 filter: %d (%s)",(ulong)__errnum,pcVar3);
    }
  }
  else {
    isobusfs_log(LOG_LEVEL_ERROR,"invalid pgn: %d");
    __errnum = 0xffffffea;
  }
  return __errnum;
}

Assistant:

int isobusfs_cmn_configure_socket_filter(int sock, pgn_t pgn)
{
	struct j1939_filter sock_filter[2] = {0};
	int ret;

	if (pgn != ISOBUSFS_PGN_CL_TO_FS && pgn != ISOBUSFS_PGN_FS_TO_CL) {
		pr_err("invalid pgn: %d", pgn);
		return -EINVAL;
	}

	/* Allow ISOBUS FS role specific PGN */
	sock_filter[0].pgn = pgn;
	sock_filter[0].pgn_mask = J1939_PGN_PDU1_MAX;

	/*
	 * ISO 11783-3:2018 - 5.4.5 Acknowledgment.
	 * Allow ACK messages for troubleshooting
	 */
	sock_filter[1].pgn = ISOBUS_PGN_ACK;
	sock_filter[1].pgn_mask = J1939_PGN_PDU1_MAX;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &sock_filter,
			 sizeof(sock_filter));
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to set j1939 filter: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}